

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetWindowFontScale(float scale)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  float fVar3;
  
  pIVar2 = GImGui;
  if (0.0 < scale) {
    pIVar1 = GImGui->CurrentWindow;
    pIVar1->WriteAccessed = true;
    pIVar1->FontWindowScale = scale;
    fVar3 = scale * pIVar2->FontBaseSize * pIVar1->FontDpiScale;
    if (pIVar1->ParentWindow != (ImGuiWindow *)0x0) {
      fVar3 = fVar3 * pIVar1->ParentWindow->FontWindowScale;
    }
    (pIVar2->DrawListSharedData).FontSize = fVar3;
    pIVar2->FontSize = fVar3;
    return;
  }
  __assert_fail("scale > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x1cc7,"void ImGui::SetWindowFontScale(float)");
}

Assistant:

void ImGui::SetWindowFontScale(float scale)
{
    IM_ASSERT(scale > 0.0f);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    window->FontWindowScale = scale;
    g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
}